

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O3

void __thiscall
pybind11::class_<asd::Frame<short,_asd::container::vec>_>::class_<>
          (class_<asd::Frame<short,_asd::container::vec>_> *this,handle scope,char *name)

{
  type_record record;
  type_record local_a0;
  
  (this->super_generic_type).super_object.super_handle.m_ptr = (PyObject *)0x0;
  detail::type_record::type_record(&local_a0);
  local_a0.type = (type_info *)&asd::Frame<short,asd::container::vec>::typeinfo;
  local_a0.type_size = 0x48;
  local_a0.type_align = 8;
  local_a0.holder_size = 8;
  local_a0.init_instance = init_instance;
  local_a0.dealloc = dealloc;
  local_a0._128_1_ = local_a0._128_1_ | 8;
  local_a0.scope.m_ptr = scope.m_ptr;
  local_a0.name = name;
  detail::generic_type::initialize(&this->super_generic_type,&local_a0);
  if (local_a0.custom_type_setup_callback.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_a0.custom_type_setup_callback.super__Function_base._M_manager)
              ((_Any_data *)&local_a0.custom_type_setup_callback,
               (_Any_data *)&local_a0.custom_type_setup_callback,__destroy_functor);
  }
  object::~object(&local_a0.bases.super_object);
  return;
}

Assistant:

class_(handle scope, const char *name, const Extra &...extra) {
        using namespace detail;

        // MI can only be specified via class_ template options, not constructor parameters
        static_assert(
            none_of<is_pyobject<Extra>...>::value || // no base class arguments, or:
                (constexpr_sum(is_pyobject<Extra>::value...) == 1 && // Exactly one base
                 constexpr_sum(is_base<options>::value...) == 0 &&   // no template option bases
                 // no multiple_inheritance attr
                 none_of<std::is_same<multiple_inheritance, Extra>...>::value),
            "Error: multiple inheritance bases must be specified via class_ template options");

        type_record record;
        record.scope = scope;
        record.name = name;
        record.type = &typeid(type);
        record.type_size = sizeof(conditional_t<has_alias, type_alias, type>);
        record.type_align = alignof(conditional_t<has_alias, type_alias, type> &);
        record.holder_size = sizeof(holder_type);
        record.init_instance = init_instance;
        record.dealloc = dealloc;
        record.default_holder = detail::is_instantiation<std::unique_ptr, holder_type>::value;

        set_operator_new<type>(&record);

        /* Register base classes specified via template arguments to class_, if any */
        PYBIND11_EXPAND_SIDE_EFFECTS(add_base<options>(record));

        /* Process optional arguments, if any */
        process_attributes<Extra...>::init(extra..., &record);

        generic_type::initialize(record);

        if (has_alias) {
            auto &instances = record.module_local ? get_local_internals().registered_types_cpp
                                                  : get_internals().registered_types_cpp;
            instances[std::type_index(typeid(type_alias))]
                = instances[std::type_index(typeid(type))];
        }
    }